

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalCodeEditor_UNIX.cxx
# Opt level: O0

int __thiscall ExternalCodeEditor::open_editor(ExternalCodeEditor *this,char *editor_cmd,char *code)

{
  int iVar1;
  char *pcVar2;
  int *piVar3;
  char *pcVar4;
  undefined1 local_c0 [8];
  stat sbuf;
  pid_t wpid;
  char *code_local;
  char *editor_cmd_local;
  ExternalCodeEditor *this_local;
  
  pcVar2 = filename(this);
  if (pcVar2 == (char *)0x0) {
    pcVar2 = tmp_filename(this);
    set_filename(this,pcVar2);
    pcVar2 = filename(this);
    if (pcVar2 == (char *)0x0) {
      return -1;
    }
  }
  pcVar2 = filename(this);
  iVar1 = is_file(pcVar2);
  if ((iVar1 != 0) && (iVar1 = is_editing(this), iVar1 != 0)) {
    sbuf.__glibc_reserved[2]._4_4_ = reap_editor(this);
    if (sbuf.__glibc_reserved[2]._4_4_ == -1) {
      piVar3 = __errno_location();
      pcVar2 = strerror(*piVar3);
      pcVar4 = filename(this);
      fl_alert("ERROR: waitpid() failed: %s\nfile=\'%s\', pid=%ld",pcVar2,pcVar4,(long)this->pid_);
      return -1;
    }
    if (sbuf.__glibc_reserved[2]._4_4_ == 0) {
      pcVar2 = filename(this);
      fl_alert("Editor Already Open\n  file=\'%s\'\n  pid=%ld",pcVar2,(long)this->pid_);
      return 0;
    }
    if (G_debug != 0) {
      printf("*** REAPED EXTERNAL EDITOR: PID %ld\n",(long)sbuf.__glibc_reserved[2]._4_4_);
    }
    pcVar2 = tmp_filename(this);
    set_filename(this,pcVar2);
  }
  pcVar2 = filename(this);
  iVar1 = save_file(pcVar2,code);
  if (iVar1 < 0) {
    this_local._4_4_ = -1;
  }
  else {
    pcVar2 = filename(this);
    iVar1 = stat64(pcVar2,(stat64 *)local_c0);
    if (iVar1 < 0) {
      pcVar2 = filename(this);
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      fl_alert("ERROR: can\'t stat(\'%s\'): %s",pcVar2,pcVar4);
      this_local._4_4_ = -1;
    }
    else {
      this->file_mtime_ = sbuf.st_atim.tv_nsec;
      this->file_size_ = sbuf.st_rdev;
      pcVar2 = filename(this);
      iVar1 = start_editor(this,editor_cmd,pcVar2);
      if (iVar1 < 0) {
        if (G_debug != 0) {
          printf("Editor failed to start\n");
        }
        this_local._4_4_ = -1;
      }
      else {
        this_local._4_4_ = 0;
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

int ExternalCodeEditor::open_editor(const char *editor_cmd,
                                    const char *code) {
  // Make sure a temp filename exists
  if ( !filename() ) {
    set_filename(tmp_filename());
    if ( !filename() ) return -1;
  }
  // See if tmpfile already exists or editor already open
  if ( is_file(filename()) ) {
    if ( is_editing() ) {
      // See if editor recently closed but not reaped; try to reap
      pid_t wpid = reap_editor();
      switch (wpid) {
        case -1:        // waitpid() failed
          fl_alert("ERROR: waitpid() failed: %s\nfile='%s', pid=%ld",
            strerror(errno), filename(), (long)pid_);
          return -1;
        case 0:         // process still running
          fl_alert("Editor Already Open\n  file='%s'\n  pid=%ld",
            filename(), (long)pid_);
          return 0;
        default:        // process reaped, wpid is pid reaped
          if ( G_debug )
            printf("*** REAPED EXTERNAL EDITOR: PID %ld\n", (long)wpid);
          break;        // fall thru to open new editor instance
      }
      // Reinstate tmp filename (reap_editor() clears it)
      set_filename(tmp_filename());
    }
  }
  if ( save_file(filename(), code) < 0 ) {
    return -1;  // errors were shown in dialog
  }
  // Update mtime/size from closed file
  struct stat sbuf;
  if ( stat(filename(), &sbuf) < 0 ) {
    fl_alert("ERROR: can't stat('%s'): %s", filename(), strerror(errno));
    return -1;
  }
  file_mtime_ = sbuf.st_mtime;
  file_size_  = sbuf.st_size;
  if ( start_editor(editor_cmd, filename()) < 0 ) { // open file in external editor
    if ( G_debug ) printf("Editor failed to start\n");
    return -1;  // errors were shown in dialog
  }
  return 0;
}